

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PinHole.cpp
# Opt level: O1

Vector3 __thiscall pm::PinHole::rayDirection(PinHole *this,float x,float y)

{
  long in_RSI;
  float fVar1;
  undefined8 uVar2;
  undefined4 extraout_XMM0_Db;
  float fVar3;
  undefined4 in_XMM1_Db;
  float fVar4;
  float fVar5;
  Vector3 VVar6;
  
  fVar1 = *(float *)(in_RSI + 0x58);
  fVar5 = (*(float *)(in_RSI + 0x3c) * y + *(float *)(in_RSI + 0x30) * x) -
          *(float *)(in_RSI + 0x48) * fVar1;
  fVar4 = (*(float *)(in_RSI + 0x40) * y + *(float *)(in_RSI + 0x34) * x) -
          *(float *)(in_RSI + 0x4c) * fVar1;
  fVar3 = (y * *(float *)(in_RSI + 0x44) + x * *(float *)(in_RSI + 0x38)) -
          fVar1 * *(float *)(in_RSI + 0x50);
  *(float *)&(this->super_Camera)._vptr_Camera = fVar5;
  *(float *)((long)&(this->super_Camera)._vptr_Camera + 4) = fVar4;
  (this->super_Camera).type_ = (Type)fVar3;
  fVar1 = fVar3 * fVar3 + fVar5 * fVar5 + fVar4 * fVar4;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
    uVar2 = CONCAT44(extraout_XMM0_Db,fVar1);
  }
  else {
    uVar2 = CONCAT44(in_XMM1_Db,SQRT(fVar1));
  }
  fVar1 = (float)uVar2;
  *(float *)&(this->super_Camera)._vptr_Camera = fVar5 / fVar1;
  *(float *)((long)&(this->super_Camera)._vptr_Camera + 4) = fVar4 / fVar1;
  VVar6.z = fVar3 / fVar1;
  (this->super_Camera).type_ = (Type)VVar6.z;
  VVar6.x = (float)(int)uVar2;
  VVar6.y = (float)(int)((ulong)uVar2 >> 0x20);
  return VVar6;
}

Assistant:

Vector3 PinHole::rayDirection(float x, float y) const
{
	Vector3 dir = x * u_ + y * v_ - distance_ * w_;
	dir.normalize();

	return dir;
}